

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O1

void __thiscall lambda::parse_from::helper::get_dot(helper *this)

{
  int iVar1;
  int iVar2;
  
  while( true ) {
    eat_whitespace(this);
    iVar1 = std::istream::get();
    if (iVar1 != 0x28) break;
    iVar2 = std::istream::peek();
    if (iVar2 != 0x2a) break;
    std::istream::get();
    comment(this);
  }
  if (iVar1 == 0x2e) {
    std::istream::get();
    return;
  }
  unexpected_thing(this);
}

Assistant:

void get_dot() {
      eat_whitespace();
	  auto ch = inp.get();
      if (ch == '(' and inp.peek() == '*') {
        inp.get();
        comment();
        return get_dot();
      }

      if (ch == '.') {
        inp.get();
      } else {
        unexpected_thing();
      }
    }